

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aVaryingInterpolationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Accuracy::VaryingInterpolationTests::init
          (VaryingInterpolationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  ulong extraout_RAX;
  ulong uVar2;
  char *pcVar3;
  InterpolationCase *pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string baseName;
  Precision local_40;
  int coordNdx;
  int precision;
  Float<unsigned_short,_5,_10,_15,_3U> local_2e;
  float local_2c;
  Float<unsigned_short,_5,_10,_15,_3U> local_26;
  float maxF16;
  Float<unsigned_int,_8,_23,_127,_3U> local_20;
  float minF16;
  Float<unsigned_int,_8,_23,_127,_3U> local_18;
  float maxF32;
  VaryingInterpolationTests *pVStack_10;
  float minF32;
  VaryingInterpolationTests *this_local;
  
  pVStack_10 = this;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_18,0x7e000000);
  maxF32 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_18);
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_20,0xfe000000);
  minF16 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_20);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_26,0x7000);
  maxF16 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_26);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_2e,0xf000);
  local_2c = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_2e);
  uVar2 = extraout_RAX;
  if ((init()::coordRanges == '\0') &&
     (uVar2 = __cxa_guard_acquire(&init()::coordRanges), (int)uVar2 != 0)) {
    init::coordRanges[0].name = "zero_to_one";
    tcu::Vector<float,_3>::Vector(&init::coordRanges[0].minVal,0.0,0.0,0.0);
    tcu::Vector<float,_3>::Vector(&init::coordRanges[0].maxVal,1.0,1.0,1.0);
    init::coordRanges[0].minPrecision = PRECISION_LOWP;
    init::coordRanges[1].name = "zero_to_minus_one";
    tcu::Vector<float,_3>::Vector(&init::coordRanges[1].minVal,0.0,0.0,0.0);
    tcu::Vector<float,_3>::Vector(&init::coordRanges[1].maxVal,-1.0,-1.0,-1.0);
    init::coordRanges[1].minPrecision = PRECISION_LOWP;
    init::coordRanges[2].name = "minus_one_to_one";
    tcu::Vector<float,_3>::Vector(&init::coordRanges[2].minVal,-1.0,-1.0,-1.0);
    tcu::Vector<float,_3>::Vector(&init::coordRanges[2].maxVal,1.0,1.0,1.0);
    init::coordRanges[2].minPrecision = PRECISION_LOWP;
    init::coordRanges[3].name = "minus_ten_to_ten";
    tcu::Vector<float,_3>::Vector(&init::coordRanges[3].minVal,-10.0,-10.0,-10.0);
    tcu::Vector<float,_3>::Vector(&init::coordRanges[3].maxVal,10.0,10.0,10.0);
    init::coordRanges[3].minPrecision = PRECISION_MEDIUMP;
    init::coordRanges[4].name = "thousands";
    tcu::Vector<float,_3>::Vector(&init::coordRanges[4].minVal,-5000.0,1000.0,1000.0);
    tcu::Vector<float,_3>::Vector(&init::coordRanges[4].maxVal,3000.0,-1000.0,7000.0);
    init::coordRanges[4].minPrecision = PRECISION_MEDIUMP;
    init::coordRanges[5].name = "full_mediump";
    tcu::Vector<float,_3>::Vector(&init::coordRanges[5].minVal,maxF16,maxF16,maxF16);
    tcu::Vector<float,_3>::Vector(&init::coordRanges[5].maxVal,local_2c,local_2c,local_2c);
    init::coordRanges[5].minPrecision = PRECISION_MEDIUMP;
    init::coordRanges[6].name = "full_highp";
    tcu::Vector<float,_3>::Vector(&init::coordRanges[6].minVal,maxF32,maxF32,maxF32);
    tcu::Vector<float,_3>::Vector(&init::coordRanges[6].maxVal,minF16,minF16,minF16);
    init::coordRanges[6].minPrecision = PRECISION_HIGHP;
    uVar2 = __cxa_guard_release(&init()::coordRanges);
  }
  local_40 = PRECISION_LOWP;
  while ((int)local_40 < 3) {
    for (baseName.field_2._12_4_ = 0; (int)baseName.field_2._12_4_ < 7;
        baseName.field_2._12_4_ = baseName.field_2._12_4_ + 1) {
      if ((int)init::coordRanges[(int)baseName.field_2._12_4_].minPrecision <= (int)local_40) {
        pcVar3 = glu::getPrecisionName(local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar3,&local_a9);
        std::operator+(&local_88,&local_a8,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,init::coordRanges[(int)baseName.field_2._12_4_].name);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
        pIVar4 = (InterpolationCase *)operator_new(0x98);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        InterpolationCase::InterpolationCase
                  (pIVar4,pCVar1,pcVar3,"",local_40,
                   &init::coordRanges[(int)baseName.field_2._12_4_].minVal,
                   &init::coordRanges[(int)baseName.field_2._12_4_].maxVal,false);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
        pIVar4 = (InterpolationCase *)operator_new(0x98);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,"_proj");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        InterpolationCase::InterpolationCase
                  (pIVar4,pCVar1,pcVar3,"",local_40,
                   &init::coordRanges[(int)baseName.field_2._12_4_].minVal,
                   &init::coordRanges[(int)baseName.field_2._12_4_].maxVal,true);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
    local_40 = local_40 + PRECISION_MEDIUMP;
    uVar2 = (ulong)local_40;
  }
  return (int)uVar2;
}

Assistant:

void VaryingInterpolationTests::init (void)
{
	DE_STATIC_ASSERT(glu::PRECISION_LOWP+1		== glu::PRECISION_MEDIUMP);
	DE_STATIC_ASSERT(glu::PRECISION_MEDIUMP+1	== glu::PRECISION_HIGHP);

	// Exp = Emax-3, Mantissa = 0
	float minF32 = tcu::Float32((0u<<31) | (0xfcu<<23) | 0x0u).asFloat();
	float maxF32 = tcu::Float32((1u<<31) | (0xfcu<<23) | 0x0u).asFloat();
	float minF16 = tcu::Float16((deUint16)((0u<<15) | (0x1cu<<10) | 0x0u)).asFloat();
	float maxF16 = tcu::Float16((deUint16)((1u<<15) | (0x1cu<<10) | 0x0u)).asFloat();

	static const struct
	{
		const char*		name;
		Vec3			minVal;
		Vec3			maxVal;
		glu::Precision	minPrecision;
	} coordRanges[] =
	{
		{ "zero_to_one",		Vec3(  0.0f,   0.0f,   0.0f), Vec3(  1.0f,   1.0f,   1.0f), glu::PRECISION_LOWP		},
		{ "zero_to_minus_one",	Vec3(  0.0f,   0.0f,   0.0f), Vec3( -1.0f,  -1.0f,  -1.0f), glu::PRECISION_LOWP		},
		{ "minus_one_to_one",	Vec3( -1.0f,  -1.0f,  -1.0f), Vec3(  1.0f,   1.0f,   1.0f), glu::PRECISION_LOWP		},
		{ "minus_ten_to_ten",	Vec3(-10.0f, -10.0f, -10.0f), Vec3( 10.0f,  10.0f,  10.0f), glu::PRECISION_MEDIUMP	},
		{ "thousands",			Vec3( -5e3f,   1e3f,   1e3f), Vec3(  3e3f,  -1e3f,   7e3f), glu::PRECISION_MEDIUMP	},
		{ "full_mediump",		Vec3(minF16, minF16, minF16), Vec3(maxF16, maxF16, maxF16), glu::PRECISION_MEDIUMP	},
		{ "full_highp",			Vec3(minF32, minF32, minF32), Vec3(maxF32, maxF32, maxF32), glu::PRECISION_HIGHP	},
	};

	for (int precision = glu::PRECISION_LOWP; precision <= glu::PRECISION_HIGHP; precision++)
	{
		for (int coordNdx = 0; coordNdx < DE_LENGTH_OF_ARRAY(coordRanges); coordNdx++)
		{
			if (precision < (int)coordRanges[coordNdx].minPrecision)
				continue;

			string baseName = string(glu::getPrecisionName((glu::Precision)precision)) + "_" + coordRanges[coordNdx].name;

			addChild(new InterpolationCase(m_context, baseName.c_str(),				"",	(glu::Precision)precision, coordRanges[coordNdx].minVal, coordRanges[coordNdx].maxVal, false));
			addChild(new InterpolationCase(m_context, (baseName + "_proj").c_str(),	"",	(glu::Precision)precision, coordRanges[coordNdx].minVal, coordRanges[coordNdx].maxVal, true));
		}
	}
}